

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alpha_dec.c
# Opt level: O0

void WebPDeallocateAlphaMemory(VP8Decoder *dec)

{
  long in_RDI;
  
  WebPSafeFree((void *)0x1630e5);
  *(undefined8 *)(in_RDI + 0xbb0) = 0;
  *(undefined8 *)(in_RDI + 3000) = 0;
  ALPHDelete((ALPHDecoder *)0x163113);
  *(undefined8 *)(in_RDI + 0xb90) = 0;
  return;
}

Assistant:

void WebPDeallocateAlphaMemory(VP8Decoder* const dec) {
  assert(dec != NULL);
  WebPSafeFree(dec->alpha_plane_mem_);
  dec->alpha_plane_mem_ = NULL;
  dec->alpha_plane_ = NULL;
  ALPHDelete(dec->alph_dec_);
  dec->alph_dec_ = NULL;
}